

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode http_req_complete(Curl_easy *data,dynbuf *r,int httpversion,Curl_HttpReq httpreq)

{
  uint uVar1;
  curl_mimepart *pcVar2;
  curl_slist *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  curl_off_t size;
  char *pcVar7;
  ulong uVar8;
  Curl_creader *reader;
  Curl_creader *local_40;
  curl_off_t local_38;
  
  if ((((data->req).field_0xd2 & 0x80) != 0) &&
     (CVar5 = Curl_httpchunk_add_reader(data), CVar5 != CURLE_OK)) {
    return CVar5;
  }
  size = Curl_creader_total_length(data);
  CVar5 = CURLE_OK;
  _Var4 = false;
  if (httpreq - HTTPREQ_POST < 4) {
    if (((-1 < size) && (uVar1 = *(uint *)&(data->req).field_0xd1, -1 < (short)uVar1)) &&
       (((uVar1 >> 0x12 & 1) != 0 ||
        (pcVar7 = Curl_checkheaders(data,"Content-Length",0xe), pcVar7 == (char *)0x0)))) {
      CVar5 = Curl_dyn_addf(r,"Content-Length: %ld\r\n",size);
    }
    if (CVar5 != CURLE_OK) goto LAB_001385c0;
    pcVar2 = (data->state).mimepost;
    if ((httpreq & (HTTPREQ_PUT|HTTPREQ_POST_FORM)) == HTTPREQ_POST_FORM &&
        pcVar2 != (curl_mimepart *)0x0) {
      local_38 = size;
      for (pcVar3 = pcVar2->curlheaders; pcVar3 != (curl_slist *)0x0; pcVar3 = pcVar3->next) {
        CVar5 = Curl_dyn_addf(r,"%s\r\n",pcVar3->data);
        if (CVar5 != CURLE_OK) {
          iVar6 = 5;
          goto LAB_00138493;
        }
      }
      CVar5 = CURLE_OK;
      iVar6 = 0;
LAB_00138493:
      if (iVar6 == 5) goto LAB_001385c0;
      size = local_38;
      if (iVar6 != 0) {
        return CVar5;
      }
    }
    if (((httpreq == HTTPREQ_POST) &&
        (pcVar7 = Curl_checkheaders(data,"Content-Type",0xc), pcVar7 == (char *)0x0)) &&
       (CVar5 = Curl_dyn_addn(r,"Content-Type: application/x-www-form-urlencoded\r\n",0x31),
       CVar5 != CURLE_OK)) goto LAB_001385c0;
    CVar5 = CURLE_OK;
    if ((data->req).upgr101 == UPGR101_INIT) {
      pcVar7 = Curl_checkheaders(data,"Expect",6);
      if (pcVar7 == (char *)0x0) {
        _Var4 = false;
        if (httpversion == 0xb) {
          CVar5 = CURLE_OK;
          if ((*(uint *)&(data->state).field_0x7be & 0x200) == 0) {
            uVar8 = Curl_creader_client_length(data);
            _Var4 = false;
            CVar5 = CURLE_OK;
            if (0x100000 < uVar8) {
              CVar5 = Curl_dyn_addn(r,"Expect: 100-continue\r\n",0x16);
              _Var4 = CVar5 == CURLE_OK;
            }
          }
        }
        else {
          CVar5 = CURLE_OK;
        }
      }
      else {
        _Var4 = Curl_compareheader(pcVar7,"Expect:",7,"100-continue",0xc);
      }
    }
    else {
      _Var4 = false;
    }
    if (CVar5 != CURLE_OK) goto LAB_001385c0;
  }
  CVar5 = Curl_dyn_addn(r,"\r\n",2);
  if (CVar5 == CURLE_OK) {
    Curl_pgrsSetUploadSize(data,size);
    CVar5 = CURLE_OK;
    if (_Var4 != false) {
      local_40 = (Curl_creader *)0x0;
      CVar5 = Curl_creader_create(&local_40,data,&cr_exp100,CURL_CR_PROTOCOL);
      if (CVar5 == CURLE_OK) {
        CVar5 = Curl_creader_add(data,local_40);
      }
      if (CVar5 == CURLE_OK) {
        *(undefined4 *)((long)local_40->ctx + 0x30) = 2;
      }
      if (local_40 != (Curl_creader *)0x0 && CVar5 != CURLE_OK) {
        Curl_creader_free(data,local_40);
      }
    }
  }
LAB_001385c0:
  if (CVar5 == CURLE_OK) {
    Curl_xfer_setup1(data,3,-1,true);
  }
  return CVar5;
}

Assistant:

static CURLcode http_req_complete(struct Curl_easy *data,
                                  struct dynbuf *r, int httpversion,
                                  Curl_HttpReq httpreq)
{
  CURLcode result = CURLE_OK;
  curl_off_t req_clen;
  bool announced_exp100 = FALSE;

  DEBUGASSERT(data->conn);
  if(data->req.upload_chunky) {
    result = Curl_httpchunk_add_reader(data);
    if(result)
      return result;
  }

  /* Get the request body length that has been set up */
  req_clen = Curl_creader_total_length(data);
  switch(httpreq) {
  case HTTPREQ_PUT:
  case HTTPREQ_POST:
#if !defined(CURL_DISABLE_MIME) || !defined(CURL_DISABLE_FORM_API)
  case HTTPREQ_POST_FORM:
  case HTTPREQ_POST_MIME:
#endif
    /* We only set Content-Length and allow a custom Content-Length if
       we do not upload data chunked, as RFC2616 forbids us to set both
       kinds of headers (Transfer-Encoding: chunked and Content-Length).
       We do not override a custom "Content-Length" header, but during
       authentication negotiation that header is suppressed.
     */
    if(req_clen >= 0 && !data->req.upload_chunky &&
       (data->req.authneg ||
        !Curl_checkheaders(data, STRCONST("Content-Length")))) {
      /* we allow replacing this header if not during auth negotiation,
         although it is not very wise to actually set your own */
      result = Curl_dyn_addf(r, "Content-Length: %" FMT_OFF_T "\r\n",
                             req_clen);
    }
    if(result)
      goto out;

#ifndef CURL_DISABLE_MIME
    /* Output mime-generated headers. */
    if(data->state.mimepost &&
       ((httpreq == HTTPREQ_POST_FORM) || (httpreq == HTTPREQ_POST_MIME))) {
      struct curl_slist *hdr;

      for(hdr = data->state.mimepost->curlheaders; hdr; hdr = hdr->next) {
        result = Curl_dyn_addf(r, "%s\r\n", hdr->data);
        if(result)
          goto out;
      }
    }
#endif
    if(httpreq == HTTPREQ_POST) {
      if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
        result = Curl_dyn_addn(r, STRCONST("Content-Type: application/"
                                           "x-www-form-urlencoded\r\n"));
        if(result)
          goto out;
      }
    }
    result = addexpect(data, r, httpversion, &announced_exp100);
    if(result)
      goto out;
    break;
  default:
    break;
  }

  /* end of headers */
  result = Curl_dyn_addn(r, STRCONST("\r\n"));
  if(!result) {
    Curl_pgrsSetUploadSize(data, req_clen);
    if(announced_exp100)
      result = http_exp100_add_reader(data);
  }

out:
  if(!result) {
    /* setup variables for the upcoming transfer */
    Curl_xfer_setup1(data, CURL_XFER_SENDRECV, -1, TRUE);
  }
  return result;
}